

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_tests.cpp
# Opt level: O0

void __thiscall fs_tests::rename::test_method(rename *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  string contents;
  ifstream file_2;
  ofstream file_1;
  ofstream file;
  string path2_contents;
  string path1_contents;
  path path2;
  path path1;
  path tmpfolder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff678;
  ArgsManager *in_stack_fffffffffffff680;
  char *in_stack_fffffffffffff688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff690;
  path *in_stack_fffffffffffff698;
  undefined7 in_stack_fffffffffffff6a0;
  undefined1 in_stack_fffffffffffff6a7;
  lazy_ostream *in_stack_fffffffffffff6a8;
  const_string *in_stack_fffffffffffff6b0;
  const_string *file_00;
  allocator<char> *in_stack_fffffffffffff6b8;
  string *this_00;
  undefined7 in_stack_fffffffffffff6c0;
  undefined1 in_stack_fffffffffffff6c7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6c8;
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [72];
  assertion_result local_840 [2];
  const_string local_808;
  lazy_ostream local_7e8 [2];
  assertion_result local_7c8 [2];
  allocator<char> local_78a;
  allocator<char> local_789;
  string local_788 [32];
  istream local_768 [600];
  ostream local_510;
  ostream local_310;
  string local_110 [32];
  pointer local_8;
  
  local_8 = *(pointer *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase(in_stack_fffffffffffff680);
  fs::path::path((path *)in_stack_fffffffffffff678,(path *)0x670fed);
  fs::operator/((path *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  fs::path::~path((path *)in_stack_fffffffffffff678);
  fs::path::path((path *)in_stack_fffffffffffff678,(path *)0x67102f);
  fs::operator/((path *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  fs::path::~path((path *)in_stack_fffffffffffff678);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6c8,
             (char *)CONCAT17(in_stack_fffffffffffff6c7,in_stack_fffffffffffff6c0),
             in_stack_fffffffffffff6b8);
  std::allocator<char>::~allocator(&local_789);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6c8,
             (char *)CONCAT17(in_stack_fffffffffffff6c7,in_stack_fffffffffffff6c0),
             in_stack_fffffffffffff6b8);
  std::allocator<char>::~allocator(&local_78a);
  std::ofstream::ofstream<fs::path,fs::path>
            ((basic_ofstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff688,
             (path *)in_stack_fffffffffffff680,(openmode)((ulong)in_stack_fffffffffffff678 >> 0x20))
  ;
  std::operator<<(&local_310,(string *)&stack0xffffffffffffff10);
  std::ofstream::~ofstream(&local_310);
  std::ofstream::ofstream<fs::path,fs::path>
            ((basic_ofstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff688,
             (path *)in_stack_fffffffffffff680,(openmode)((ulong)in_stack_fffffffffffff678 >> 0x20))
  ;
  std::operator<<(&local_510,local_110);
  std::ofstream::~ofstream(&local_510);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff688,
               (pointer)in_stack_fffffffffffff680,(unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
               (size_t)in_stack_fffffffffffff6a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff6a7,in_stack_fffffffffffff6a0));
    fs::path::path((path *)in_stack_fffffffffffff678,(path *)0x6711ce);
    fs::path::path((path *)in_stack_fffffffffffff678,(path *)0x6711e5);
    RenameOver(in_stack_fffffffffffff698,(path *)in_stack_fffffffffffff690);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff688,
               SUB81((ulong)in_stack_fffffffffffff680 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff688,
               (pointer)in_stack_fffffffffffff680,(unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff680,
               (basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff688,
               (pointer)in_stack_fffffffffffff680,(unsigned_long)in_stack_fffffffffffff678);
    in_stack_fffffffffffff678 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7c8,local_7e8,&local_808,0x81,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff678);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff678);
    fs::path::~path((path *)in_stack_fffffffffffff678);
    fs::path::~path((path *)in_stack_fffffffffffff678);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff688,
               (pointer)in_stack_fffffffffffff680,(unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
               (size_t)in_stack_fffffffffffff6a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff6a7,in_stack_fffffffffffff6a0));
    fs::exists((path *)in_stack_fffffffffffff678);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff688,
               SUB81((ulong)in_stack_fffffffffffff680 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff688,
               (pointer)in_stack_fffffffffffff680,(unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff680,
               (basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff688,
               (pointer)in_stack_fffffffffffff680,(unsigned_long)in_stack_fffffffffffff678);
    in_stack_fffffffffffff678 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_840,(lazy_ostream *)&stack0xfffffffffffff7a0,(const_string *)(local_8c0 + 0x40)
               ,0x83,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff678);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff678);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::ifstream::ifstream<fs::path,fs::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff688,
             (path *)in_stack_fffffffffffff680,(openmode)((ulong)in_stack_fffffffffffff678 >> 0x20))
  ;
  this_00 = local_788;
  std::__cxx11::string::string(in_stack_fffffffffffff690);
  std::operator>>(local_768,this_00);
  do {
    file_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff688,
               (pointer)in_stack_fffffffffffff680,(unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,file_00,(size_t)in_stack_fffffffffffff6a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff6a7,in_stack_fffffffffffff6a0));
    in_stack_fffffffffffff6a8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff680,(char (*) [1])in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff688,
               (pointer)in_stack_fffffffffffff680,(unsigned_long)in_stack_fffffffffffff678);
    in_stack_fffffffffffff688 = "path1_contents";
    in_stack_fffffffffffff680 = (ArgsManager *)&stack0xffffffffffffff10;
    in_stack_fffffffffffff678 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1bbfa23;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_8c0,local_8d0,0x89,1,2,local_788);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff678);
    in_stack_fffffffffffff6a7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff6a7);
  std::__cxx11::string::~string(in_stack_fffffffffffff678);
  std::ifstream::~ifstream(local_768);
  std::filesystem::remove((path *)&stack0xffffffffffffff58);
  std::__cxx11::string::~string(in_stack_fffffffffffff678);
  std::__cxx11::string::~string(in_stack_fffffffffffff678);
  fs::path::~path((path *)in_stack_fffffffffffff678);
  fs::path::~path((path *)in_stack_fffffffffffff678);
  fs::path::~path((path *)in_stack_fffffffffffff678);
  if (*(pointer *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(rename)
{
    const fs::path tmpfolder{m_args.GetDataDirBase()};

    const fs::path path1{tmpfolder / "a"};
    const fs::path path2{tmpfolder / "b"};

    const std::string path1_contents{"1111"};
    const std::string path2_contents{"2222"};

    {
        std::ofstream file{path1};
        file << path1_contents;
    }

    {
        std::ofstream file{path2};
        file << path2_contents;
    }

    // Rename path1 -> path2.
    BOOST_CHECK(RenameOver(path1, path2));

    BOOST_CHECK(!fs::exists(path1));

    {
        std::ifstream file{path2};
        std::string contents;
        file >> contents;
        BOOST_CHECK_EQUAL(contents, path1_contents);
    }
    fs::remove(path2);
}